

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
::
find_or_prepare_insert_non_soo<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>
          (pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>,_absl::lts_20240722::hash_internal::Hash<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::equal_to<std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,_std::pair<int,_int>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>,std::pair<int,int>>,absl::lts_20240722::hash_internal::Hash<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::equal_to<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>,std::allocator<std::pair<std::pair<google::protobuf::Message_const*,google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>const,std::pair<int,int>>>>
          *this,pair<const_google::protobuf::Message_*,_google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>
                *key)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ushort uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  char cVar9;
  long lVar10;
  uint uVar11;
  uint64_t v;
  ctrl_t *pcVar12;
  ushort uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  anon_union_8_1_a8a14541_for_iterator_2 aVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  __m128i match;
  FindInfo FVar24;
  ulong local_68;
  char cVar21;
  char cVar22;
  char cVar23;
  
  uVar2 = *(ulong *)(this + 0x10);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = (long)&hash_internal::MixingHashState::kSeed + (long)key->first;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)&(key->first->super_MessageLite)._vptr_MessageLite +
                 (SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar18 * ZEXT816(0x9ddfea08eb382d69),8));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),0) ^
                 SUB168(auVar6 * ZEXT816(0x9ddfea08eb382d69),8)) + (ulong)key->second;
  uVar3 = *(ulong *)this;
  if ((uVar3 + 1 & uVar3) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x145,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  uVar16 = SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8) ^
           SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0);
  uVar15 = (uVar16 >> 7 ^ uVar2 >> 0xc) & uVar3;
  auVar18 = ZEXT216(CONCAT11((char)uVar16,(char)uVar16) & 0x7f7f);
  auVar18 = pshuflw(auVar18,auVar18,0);
  pcVar12 = (__return_storage_ptr__->first).ctrl_;
  aVar17 = (__return_storage_ptr__->first).field_1;
  bVar8 = __return_storage_ptr__->second;
  local_68 = 0;
  do {
    pcVar1 = (char *)(uVar2 + uVar15);
    cVar9 = auVar18[0];
    auVar20[0] = -(cVar9 == *pcVar1);
    cVar21 = auVar18[1];
    auVar20[1] = -(cVar21 == pcVar1[1]);
    cVar22 = auVar18[2];
    auVar20[2] = -(cVar22 == pcVar1[2]);
    cVar23 = auVar18[3];
    auVar20[3] = -(cVar23 == pcVar1[3]);
    auVar20[4] = -(cVar9 == pcVar1[4]);
    auVar20[5] = -(cVar21 == pcVar1[5]);
    auVar20[6] = -(cVar22 == pcVar1[6]);
    auVar20[7] = -(cVar23 == pcVar1[7]);
    auVar20[8] = -(cVar9 == pcVar1[8]);
    auVar20[9] = -(cVar21 == pcVar1[9]);
    auVar20[10] = -(cVar22 == pcVar1[10]);
    auVar20[0xb] = -(cVar23 == pcVar1[0xb]);
    auVar20[0xc] = -(cVar9 == pcVar1[0xc]);
    auVar20[0xd] = -(cVar21 == pcVar1[0xd]);
    auVar20[0xe] = -(cVar22 == pcVar1[0xe]);
    auVar20[0xf] = -(cVar23 == pcVar1[0xf]);
    uVar13 = (ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe | (ushort)(auVar20[0xf] >> 7) << 0xf;
    uVar11 = (uint)uVar13;
    if (uVar13 != 0) {
      lVar10 = *(long *)(this + 0x18);
      do {
        uVar4 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        uVar14 = uVar4 + uVar15 & uVar3;
        if ((*(Message **)(lVar10 + uVar14 * 0x18) == key->first) &&
           (*(ErrorLocation *)(lVar10 + 8 + uVar14 * 0x18) == key->second)) {
          (__return_storage_ptr__->first).field_1 = aVar17;
          __return_storage_ptr__->second = bVar8;
          (__return_storage_ptr__->first).ctrl_ = pcVar12;
          if (*(long *)(this + 0x10) != 0) {
            (__return_storage_ptr__->first).ctrl_ = (ctrl_t *)(*(long *)(this + 0x10) + uVar14);
            (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)(lVar10 + uVar14 * 0x18);
            __return_storage_ptr__->second = false;
            return __return_storage_ptr__;
          }
          goto LAB_001da119;
        }
        uVar13 = (ushort)(uVar11 - 1) & (ushort)uVar11;
        uVar11 = CONCAT22((short)(uVar11 - 1 >> 0x10),uVar13);
      } while (uVar13 != 0);
    }
    auVar19[0] = -(*pcVar1 == -0x80);
    auVar19[1] = -(pcVar1[1] == -0x80);
    auVar19[2] = -(pcVar1[2] == -0x80);
    auVar19[3] = -(pcVar1[3] == -0x80);
    auVar19[4] = -(pcVar1[4] == -0x80);
    auVar19[5] = -(pcVar1[5] == -0x80);
    auVar19[6] = -(pcVar1[6] == -0x80);
    auVar19[7] = -(pcVar1[7] == -0x80);
    auVar19[8] = -(pcVar1[8] == -0x80);
    auVar19[9] = -(pcVar1[9] == -0x80);
    auVar19[10] = -(pcVar1[10] == -0x80);
    auVar19[0xb] = -(pcVar1[0xb] == -0x80);
    auVar19[0xc] = -(pcVar1[0xc] == -0x80);
    auVar19[0xd] = -(pcVar1[0xd] == -0x80);
    auVar19[0xe] = -(pcVar1[0xe] == -0x80);
    auVar19[0xf] = -(pcVar1[0xf] == -0x80);
    uVar13 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    if (uVar13 == 0) {
      if (*(ulong *)this < local_68 + 0x10) {
        (__return_storage_ptr__->first).field_1 = aVar17;
        __return_storage_ptr__->second = bVar8;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
        __assert_fail("seq.index() <= capacity() && \"full table!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0xef5,
                      "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>, K = std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>]"
                     );
      }
      uVar15 = uVar15 + local_68 + 0x10 & uVar3;
      local_68 = local_68 + 0x10;
    }
    else {
      cVar9 = absl::lts_20240722::container_internal::ShouldInsertBackwardsForDebug
                        (*(ulong *)this,uVar16,*(ctrl_t **)(this + 0x10));
      if (cVar9 == '\0') {
        uVar11 = 0;
        if (uVar13 != 0) {
          for (; (uVar13 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
      }
      else {
        uVar5 = 0xf;
        if (uVar13 != 0) {
          for (; uVar13 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar11 = (ushort)((uVar5 ^ 0xfff0) + 0x11) - 1;
      }
      FVar24.offset = uVar11 + uVar15 & uVar3;
      FVar24.probe_length = local_68;
      lVar10 = absl::lts_20240722::container_internal::PrepareInsertNonSoo
                         ((CommonFields *)this,uVar16,FVar24,
                          (PolicyFunctions *)GetPolicyFunctions()::value);
      if (*(long *)(this + 0x10) == 0) {
        (__return_storage_ptr__->first).field_1 = aVar17;
        __return_storage_ptr__->second = bVar8;
        (__return_storage_ptr__->first).ctrl_ = pcVar12;
LAB_001da119:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9c4,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>, Hash = absl::hash_internal::Hash<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Eq = std::equal_to<std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>>, Alloc = std::allocator<std::pair<const std::pair<const google::protobuf::Message *, google::protobuf::DescriptorPool::ErrorCollector::ErrorLocation>, std::pair<int, int>>>]"
                     );
      }
      pcVar12 = (ctrl_t *)(*(long *)(this + 0x10) + lVar10);
      aVar17.slot_ = (slot_type *)(lVar10 * 0x18 + *(long *)(this + 0x18));
      bVar8 = true;
    }
    if (uVar13 != 0) {
      (__return_storage_ptr__->first).field_1.slot_ = (slot_type *)aVar17;
      __return_storage_ptr__->second = bVar8;
      (__return_storage_ptr__->first).ctrl_ = pcVar12;
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    assert(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      assert(seq.index() <= capacity() && "full table!");
    }
  }